

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_tables.cpp
# Opt level: O0

bool ImGui::BeginTableEx(char *name,ImGuiID id,int columns_count,ImGuiTableFlags flags,
                        ImVec2 *outer_size,float inner_width)

{
  ImGuiWindow *pIVar1;
  ImVec2 IVar2;
  bool bVar3;
  int iVar4;
  ImU32 IVar5;
  float *pfVar6;
  char *pcVar7;
  ImGuiTableColumn *pIVar8;
  uint in_ECX;
  int in_EDX;
  ImGuiID in_ESI;
  ImGuiTable *in_RDI;
  ImGuiWindowTempData *min;
  ImVec2 *in_R8;
  float in_XMM0_Da;
  float fVar9;
  float fVar10;
  float fVar11;
  ImRect IVar12;
  int n_1;
  float scale_factor;
  float new_ref_scale_unit;
  float width_auto;
  ImGuiTableColumn *column;
  int n;
  int old_columns_count;
  void *old_columns_raw_data;
  ImGuiTableColumn *old_columns_to_preserve;
  float outer_padding_explicit;
  float outer_padding_for_border;
  float inner_padding_explicit;
  float inner_spacing_explicit;
  float inner_spacing_for_border;
  bool pad_inner_x;
  bool pad_outer_x;
  ImGuiWindow *inner_window;
  ImGuiWindowFlags child_flags;
  ImVec2 override_content_size;
  ImGuiTableTempData *temp_data;
  int table_idx;
  ImGuiTableFlags table_last_flags;
  ImGuiID instance_id;
  int instance_no;
  ImGuiTable *table;
  ImRect outer_rect;
  ImVec2 actual_outer_size;
  ImVec2 avail_size;
  bool use_child_window;
  ImGuiWindow *outer_window;
  ImGuiContext *g;
  undefined4 in_stack_fffffffffffffd68;
  float in_stack_fffffffffffffd6c;
  ImGuiTableColumnIdx IVar13;
  undefined4 in_stack_fffffffffffffd70;
  ImGuiID in_stack_fffffffffffffd74;
  ImPool<ImGuiTable> *in_stack_fffffffffffffd78;
  int iVar14;
  ImRect *r;
  float in_stack_fffffffffffffd80;
  float fVar15;
  float in_stack_fffffffffffffd84;
  ImGuiCol idx;
  float in_stack_fffffffffffffd88;
  float fVar16;
  float in_stack_fffffffffffffd8c;
  undefined4 uVar17;
  ImGuiWindowFlags in_stack_fffffffffffffd98;
  undefined3 uVar18;
  uint in_stack_fffffffffffffd9c;
  ImGuiTable *in_stack_fffffffffffffda0;
  float in_stack_fffffffffffffdac;
  float in_stack_fffffffffffffdb0;
  float in_stack_fffffffffffffdb4;
  undefined4 in_stack_fffffffffffffdc0;
  int in_stack_fffffffffffffdc4;
  int local_22c;
  int local_218;
  undefined1 local_20c [104];
  float local_1a4;
  ImGuiTableColumn *local_1a0;
  int local_198;
  int local_194;
  void *local_190;
  ImGuiTableColumn *local_188;
  undefined4 local_17c;
  float local_178;
  float local_174;
  float local_170;
  float local_16c;
  float local_168;
  byte local_162;
  char local_161;
  ImVec2 local_160;
  ImGuiWindow *local_158;
  ImVec2 local_14c;
  ImVec2 local_144;
  ImVec2 local_13c;
  uint local_134;
  ImVec2 local_130;
  ImVec2 local_128;
  ImVec2 local_120;
  ImGuiTableTempData *local_118;
  ImPoolIdx local_90;
  uint local_8c;
  int local_88;
  int local_84;
  ImGuiTable *local_80;
  ImVec2 local_74;
  ImRect local_6c;
  ImVec2 local_5c;
  ImVec2 local_54;
  ImVec2 local_4c;
  byte local_41;
  ImGuiWindow *local_40;
  ImGuiContext *local_38;
  float local_2c;
  ImVec2 *local_28;
  uint local_1c;
  int local_18;
  ImGuiID local_14;
  ImGuiTable *local_10;
  bool local_1;
  
  local_38 = GImGui;
  local_2c = in_XMM0_Da;
  local_28 = in_R8;
  local_1c = in_ECX;
  local_18 = in_EDX;
  local_14 = in_ESI;
  local_10 = in_RDI;
  local_40 = GetCurrentWindow();
  if ((local_40->SkipItems & 1U) == 0) {
    local_41 = (local_1c & 0x3000000) != 0;
    local_4c = GetContentRegionAvail();
    local_5c = *local_28;
    ImMax<float>(local_4c.x,1.0);
    if ((local_41 & 1) != 0) {
      ImMax<float>(local_4c.y,1.0);
    }
    IVar2.y = in_stack_fffffffffffffd8c;
    IVar2.x = in_stack_fffffffffffffd88;
    local_54 = CalcItemSize(IVar2,in_stack_fffffffffffffd84,in_stack_fffffffffffffd80);
    min = &local_40->DC;
    local_74 = operator+((ImVec2 *)CONCAT44(in_stack_fffffffffffffd6c,in_stack_fffffffffffffd68),
                         (ImVec2 *)0x188acd);
    ImRect::ImRect(&local_6c,&min->CursorPos,&local_74);
    if (((local_41 & 1) == 0) ||
       (bVar3 = IsClippedEx((ImRect *)in_stack_fffffffffffffd78,in_stack_fffffffffffffd74), !bVar3))
    {
      local_80 = ImPool<ImGuiTable>::GetOrAddByKey
                           (in_stack_fffffffffffffd78,in_stack_fffffffffffffd74);
      iVar14 = (int)((ulong)in_stack_fffffffffffffd78 >> 0x20);
      if (local_80->LastFrameActive == local_38->FrameCount) {
        local_22c = local_80->InstanceCurrent + 1;
      }
      else {
        local_22c = 0;
      }
      local_84 = local_22c;
      local_88 = local_14 + local_22c;
      local_8c = local_80->Flags;
      local_90 = ImPool<ImGuiTable>::GetIndex(&local_38->Tables,local_80);
      iVar4 = local_38->TablesTempDataStacked + 1;
      local_38->TablesTempDataStacked = iVar4;
      if ((local_38->TablesTempData).Size < iVar4) {
        in_stack_fffffffffffffdc4 = local_38->TablesTempDataStacked;
        ImGuiTableTempData::ImGuiTableTempData
                  ((ImGuiTableTempData *)
                   CONCAT44(in_stack_fffffffffffffd84,in_stack_fffffffffffffd80));
        ImVector<ImGuiTableTempData>::resize
                  ((ImVector<ImGuiTableTempData> *)
                   CONCAT44(in_stack_fffffffffffffd84,in_stack_fffffffffffffd80),iVar14,
                   (ImGuiTableTempData *)
                   CONCAT44(in_stack_fffffffffffffd74,in_stack_fffffffffffffd70));
        ImGuiTableTempData::~ImGuiTableTempData((ImGuiTableTempData *)0x188c6a);
      }
      local_118 = ImVector<ImGuiTableTempData>::operator[]
                            (&local_38->TablesTempData,local_38->TablesTempDataStacked + -1);
      local_80->TempData = local_118;
      local_118->TableIndex = local_90;
      local_80->DrawSplitter = &local_80->TempData->DrawSplitter;
      ImDrawListSplitter::Clear(local_80->DrawSplitter);
      local_80->IsDefaultSizingPolicy = (local_1c & 0xe000) == 0;
      local_1c = TableFixFlags(local_1c,local_40);
      local_80->ID = local_14;
      local_80->Flags = local_1c;
      local_80->InstanceCurrent = (ImS16)local_84;
      local_80->LastFrameActive = local_38->FrameCount;
      local_80->InnerWindow = local_40;
      local_80->OuterWindow = local_40;
      local_80->ColumnsCount = local_18;
      local_80->IsLayoutLocked = false;
      local_80->InnerWidth = local_2c;
      local_118->UserOuterSize = *local_28;
      if ((local_41 & 1) == 0) {
        (local_80->InnerRect).Min = local_6c.Min;
        (local_80->InnerRect).Max = local_6c.Max;
        (local_80->OuterRect).Min = (local_80->InnerRect).Min;
        (local_80->OuterRect).Max = (local_80->InnerRect).Max;
        (local_80->WorkRect).Min = (local_80->OuterRect).Min;
        (local_80->WorkRect).Max = (local_80->OuterRect).Max;
      }
      else {
        ImVec2::ImVec2(&local_120,3.4028235e+38,3.4028235e+38);
        if (((local_1c & 0x1000000) != 0) && ((local_1c & 0x2000000) == 0)) {
          local_120.y = 1.1754944e-38;
        }
        if (((local_1c & 0x1000000) != 0) && (0.0 < local_2c)) {
          local_120.x = local_2c;
        }
        if ((((local_120.x != 3.4028235e+38) || (NAN(local_120.x))) ||
            (local_120.y != 3.4028235e+38)) || (NAN(local_120.y))) {
          in_stack_fffffffffffffdb0 = local_120.x;
          if ((local_120.x == 3.4028235e+38) && (!NAN(local_120.x))) {
            in_stack_fffffffffffffdb0 = 0.0;
          }
          in_stack_fffffffffffffdac = local_120.y;
          if ((local_120.y == 3.4028235e+38) && (!NAN(local_120.y))) {
            in_stack_fffffffffffffdac = 0.0;
          }
          in_stack_fffffffffffffdb4 = in_stack_fffffffffffffdb0;
          ImVec2::ImVec2(&local_128,in_stack_fffffffffffffdb0,in_stack_fffffffffffffdac);
          SetNextWindowContentSize
                    ((ImVec2 *)CONCAT44(in_stack_fffffffffffffd74,in_stack_fffffffffffffd70));
        }
        if ((local_8c & 0x3000000) == 0) {
          ImVec2::ImVec2(&local_130,0.0,0.0);
          SetNextWindowScroll(&local_130);
        }
        local_134 = (local_1c & 0x1000000) >> 0xd;
        local_13c = ImRect::GetSize((ImRect *)
                                    CONCAT44(in_stack_fffffffffffffd6c,in_stack_fffffffffffffd68));
        BeginChildEx((char *)CONCAT44(in_stack_fffffffffffffdb4,in_stack_fffffffffffffdb0),
                     (ImGuiID)in_stack_fffffffffffffdac,(ImVec2 *)local_10,
                     SUB41(in_stack_fffffffffffffd9c >> 0x18,0),in_stack_fffffffffffffd98);
        local_80->InnerWindow = local_38->CurrentWindow;
        IVar2 = (local_80->InnerWindow->WorkRect).Max;
        (local_80->WorkRect).Min = (local_80->InnerWindow->WorkRect).Min;
        (local_80->WorkRect).Max = IVar2;
        IVar12 = ImGuiWindow::Rect((ImGuiWindow *)0x18905d);
        local_144 = IVar12.Max;
        local_14c = IVar12.Min;
        (local_80->OuterRect).Min = local_14c;
        (local_80->OuterRect).Max = local_144;
        pIVar1 = local_80->InnerWindow;
        (local_80->InnerRect).Min = (pIVar1->InnerRect).Min;
        (local_80->InnerRect).Max = (pIVar1->InnerRect).Max;
        in_stack_fffffffffffffda0 = local_10;
      }
      PushOverrideID(in_stack_fffffffffffffd74);
      local_158 = local_80->InnerWindow;
      local_80->HostIndentX = (local_158->DC).Indent.x;
      (local_80->HostClipRect).Min = (local_158->ClipRect).Min;
      (local_80->HostClipRect).Max = (local_158->ClipRect).Max;
      local_80->HostSkipItems = (bool)(local_158->SkipItems & 1);
      (local_118->HostBackupWorkRect).Min = (local_158->WorkRect).Min;
      (local_118->HostBackupWorkRect).Max = (local_158->WorkRect).Max;
      (local_118->HostBackupParentWorkRect).Min = (local_158->ParentWorkRect).Min;
      (local_118->HostBackupParentWorkRect).Max = (local_158->ParentWorkRect).Max;
      (local_118->HostBackupColumnsOffset).x = (local_40->DC).ColumnsOffset.x;
      local_118->HostBackupPrevLineSize = (local_158->DC).PrevLineSize;
      local_118->HostBackupCurrLineSize = (local_158->DC).CurrLineSize;
      local_118->HostBackupCursorMaxPos = (local_158->DC).CursorMaxPos;
      local_118->HostBackupItemWidth = (local_40->DC).ItemWidth;
      local_118->HostBackupItemWidthStackSize = (local_40->DC).ItemWidthStack.Size;
      ImVec2::ImVec2(&local_160,0.0,0.0);
      (local_158->DC).CurrLineSize = local_160;
      (local_158->DC).PrevLineSize = (local_158->DC).CurrLineSize;
      if ((local_1c & 0x400000) == 0) {
        if ((local_1c & 0x200000) == 0) {
          uVar18 = CONCAT12((local_1c & 0x400) != 0,(short)in_stack_fffffffffffffd9c);
        }
        else {
          uVar18 = CONCAT12(1,(short)in_stack_fffffffffffffd9c);
        }
        in_stack_fffffffffffffd9c = CONCAT13((char)((uint3)uVar18 >> 0x10),uVar18);
      }
      else {
        in_stack_fffffffffffffd9c = in_stack_fffffffffffffd9c & 0xffffff;
      }
      local_161 = (char)(in_stack_fffffffffffffd9c >> 0x18);
      local_162 = -((local_1c & 0x800000) == 0) & 1;
      uVar17 = 0;
      local_168 = 1.0;
      if ((local_1c & 0x200) == 0) {
        local_168 = 0.0;
      }
      if ((local_162 == 0) || ((local_1c & 0x200) != 0)) {
        fVar9 = 0.0;
      }
      else {
        fVar9 = (local_38->Style).CellPadding.x;
      }
      if ((local_162 == 0) || ((local_1c & 0x200) == 0)) {
        fVar10 = 0.0;
      }
      else {
        fVar10 = (local_38->Style).CellPadding.x;
      }
      local_80->CellSpacingX1 = fVar9 + local_168;
      local_80->CellSpacingX2 = fVar9;
      local_80->CellPaddingX = fVar10;
      local_80->CellPaddingY = (local_38->Style).CellPadding.y;
      idx = 0;
      fVar16 = 1.0;
      if ((local_1c & 0x400) == 0) {
        fVar16 = 0.0;
      }
      if (local_161 == '\0') {
        fVar15 = 0.0;
      }
      else {
        fVar15 = (local_38->Style).CellPadding.x;
      }
      local_80->OuterPaddingX = (fVar16 + fVar15) - local_80->CellPaddingX;
      local_80->CurrentColumn = -1;
      local_80->CurrentRow = -1;
      local_80->RowBgColorCounter = 0;
      *(uint *)&local_80->field_0x98 = *(uint *)&local_80->field_0x98 & 0xffff;
      if (local_158 == local_40) {
        r = &local_80->WorkRect;
      }
      else {
        r = &local_158->ClipRect;
      }
      (local_80->InnerClipRect).Min = r->Min;
      (local_80->InnerClipRect).Max = r->Max;
      local_178 = fVar15;
      local_174 = fVar16;
      local_170 = fVar10;
      local_16c = fVar9;
      ImRect::ClipWith((ImRect *)(ulong)(uint)fVar15,r);
      iVar14 = (int)((ulong)r >> 0x20);
      ImRect::ClipWithFull((ImRect *)CONCAT44(uVar17,fVar9),(ImRect *)CONCAT44(fVar10,fVar16));
      if ((local_1c & 0x20000) == 0) {
        fVar9 = (local_158->ClipRect).Max.y;
      }
      else {
        fVar9 = ImMin<float>((local_80->InnerClipRect).Max.y,(local_158->WorkRect).Max.y);
      }
      (local_80->InnerClipRect).Max.y = fVar9;
      fVar10 = (local_80->WorkRect).Min.y;
      local_80->RowPosY2 = fVar10;
      local_80->RowPosY1 = fVar10;
      local_80->RowTextBaseline = 0.0;
      local_80->FreezeRowsCount = '\0';
      local_80->FreezeRowsRequest = '\0';
      local_80->FreezeColumnsCount = '\0';
      local_80->FreezeColumnsRequest = '\0';
      local_80->IsUnfrozenRows = true;
      local_80->DeclColumnsCount = '\0';
      IVar5 = GetColorU32(idx,fVar15);
      local_80->BorderColorStrong = IVar5;
      IVar5 = GetColorU32(idx,fVar15);
      local_80->BorderColorLight = IVar5;
      local_38->CurrentTable = local_80;
      (local_40->DC).CurrentTableIdx = local_90;
      if (local_158 != local_40) {
        (local_158->DC).CurrentTableIdx = local_90;
      }
      if (((local_8c & 2) != 0) && ((local_1c & 2) == 0)) {
        local_80->IsResetDisplayOrderRequest = true;
      }
      if ((local_38->TablesLastTimeActive).Size <= local_90) {
        local_17c = 0xbf800000;
        ImVector<float>::resize
                  ((ImVector<float> *)CONCAT44(idx,fVar15),iVar14,
                   (float *)CONCAT44(fVar9,in_stack_fffffffffffffd70));
      }
      fVar10 = (float)local_38->Time;
      pfVar6 = ImVector<float>::operator[](&local_38->TablesLastTimeActive,local_90);
      *pfVar6 = fVar10;
      local_118->LastTimeActive = (float)local_38->Time;
      local_80->MemoryCompacted = false;
      local_188 = (ImGuiTableColumn *)0x0;
      local_190 = (void *)0x0;
      local_194 = ImSpan<ImGuiTableColumn>::size(&local_80->Columns);
      if ((local_194 != 0) && (local_194 != local_18)) {
        local_188 = (local_80->Columns).Data;
        local_190 = local_80->RawData;
        local_80->RawData = (void *)0x0;
      }
      if (local_80->RawData == (void *)0x0) {
        TableBeginInitMemory(in_stack_fffffffffffffda0,in_stack_fffffffffffffd9c);
        local_80->IsSettingsRequestLoad = true;
        local_80->IsInitializing = true;
      }
      if ((local_80->IsResetAllRequest & 1U) != 0) {
        TableResetSettings(local_80);
      }
      if ((local_80->IsInitializing & 1U) != 0) {
        local_80->SettingsOffset = -1;
        local_80->IsSortSpecsDirty = true;
        local_80->InstanceInteracted = -1;
        local_80->ContextPopupColumn = -1;
        local_80->LastResizedColumn = -1;
        local_80->ResizedColumn = -1;
        local_80->ReorderColumn = -1;
        local_80->AutoFitSingleColumn = -1;
        local_80->HoveredColumnBorder = -1;
        local_80->HoveredColumnBody = -1;
        for (local_198 = 0; local_198 < local_18; local_198 = local_198 + 1) {
          local_1a0 = ImSpan<ImGuiTableColumn>::operator[](&local_80->Columns,local_198);
          if ((local_188 == (ImGuiTableColumn *)0x0) || (local_194 <= local_198)) {
            local_1a4 = local_1a0->WidthAuto;
            ImGuiTableColumn::ImGuiTableColumn((ImGuiTableColumn *)CONCAT44(fVar9,fVar10));
            memcpy(local_1a0,local_20c,0x67);
            local_1a0->WidthAuto = local_1a4;
            local_1a0->IsPreserveWidthAuto = true;
            local_1a0->IsUserEnabledNextFrame = true;
            local_1a0->IsUserEnabled = true;
            local_1a0->IsEnabled = true;
          }
          else {
            memcpy(local_1a0,local_188 + local_198,0x67);
          }
          in_stack_fffffffffffffd6c =
               (float)CONCAT13((char)local_198,SUB43(in_stack_fffffffffffffd6c,0));
          pcVar7 = ImSpan<signed_char>::operator[](&local_80->DisplayOrderToIndex,local_198);
          IVar13 = (ImGuiTableColumnIdx)((uint)in_stack_fffffffffffffd6c >> 0x18);
          *pcVar7 = IVar13;
          local_1a0->DisplayOrder = IVar13;
        }
      }
      if (local_190 != (void *)0x0) {
        MemFree((void *)CONCAT44(fVar9,fVar10));
      }
      if ((local_80->IsSettingsRequestLoad & 1U) != 0) {
        TableLoadSettings((ImGuiTable *)
                          CONCAT44(in_stack_fffffffffffffdc4,in_stack_fffffffffffffdc0));
      }
      fVar16 = local_38->FontSize;
      if (((local_80->RefScale != 0.0) || (NAN(local_80->RefScale))) &&
         ((local_80->RefScale != fVar16 || (NAN(local_80->RefScale) || NAN(fVar16))))) {
        fVar15 = local_80->RefScale;
        for (local_218 = 0; local_218 < local_18; local_218 = local_218 + 1) {
          pIVar8 = ImSpan<ImGuiTableColumn>::operator[](&local_80->Columns,local_218);
          fVar11 = pIVar8->WidthRequest * (fVar16 / fVar15);
          pIVar8 = ImSpan<ImGuiTableColumn>::operator[](&local_80->Columns,local_218);
          pIVar8->WidthRequest = fVar11;
        }
      }
      local_80->RefScale = fVar16;
      local_158->SkipItems = true;
      if (0 < (local_80->ColumnsNames).Buf.Size) {
        ImVector<char>::resize
                  ((ImVector<char> *)CONCAT44(fVar9,fVar10),(int)in_stack_fffffffffffffd6c);
      }
      TableBeginApplyRequests
                ((ImGuiTable *)CONCAT44(in_stack_fffffffffffffdc4,in_stack_fffffffffffffdc0));
      local_1 = true;
    }
    else {
      ItemSize((ImRect *)CONCAT44(in_stack_fffffffffffffd74,in_stack_fffffffffffffd70),
               in_stack_fffffffffffffd6c);
      local_1 = false;
    }
  }
  else {
    local_1 = false;
  }
  return local_1;
}

Assistant:

bool    ImGui::BeginTableEx(const char* name, ImGuiID id, int columns_count, ImGuiTableFlags flags, const ImVec2& outer_size, float inner_width)
{
    ImGuiContext& g = *GImGui;
    ImGuiWindow* outer_window = GetCurrentWindow();
    if (outer_window->SkipItems) // Consistent with other tables + beneficial side effect that assert on miscalling EndTable() will be more visible.
        return false;

    // Sanity checks
    IM_ASSERT(columns_count > 0 && columns_count <= IMGUI_TABLE_MAX_COLUMNS && "Only 1..64 columns allowed!");
    if (flags & ImGuiTableFlags_ScrollX)
        IM_ASSERT(inner_width >= 0.0f);

    // If an outer size is specified ahead we will be able to early out when not visible. Exact clipping rules may evolve.
    const bool use_child_window = (flags & (ImGuiTableFlags_ScrollX | ImGuiTableFlags_ScrollY)) != 0;
    const ImVec2 avail_size = GetContentRegionAvail();
    ImVec2 actual_outer_size = CalcItemSize(outer_size, ImMax(avail_size.x, 1.0f), use_child_window ? ImMax(avail_size.y, 1.0f) : 0.0f);
    ImRect outer_rect(outer_window->DC.CursorPos, outer_window->DC.CursorPos + actual_outer_size);
    if (use_child_window && IsClippedEx(outer_rect, 0))
    {
        ItemSize(outer_rect);
        return false;
    }

    // Acquire storage for the table
    ImGuiTable* table = g.Tables.GetOrAddByKey(id);
    const int instance_no = (table->LastFrameActive != g.FrameCount) ? 0 : table->InstanceCurrent + 1;
    const ImGuiID instance_id = id + instance_no;
    const ImGuiTableFlags table_last_flags = table->Flags;
    if (instance_no > 0)
        IM_ASSERT(table->ColumnsCount == columns_count && "BeginTable(): Cannot change columns count mid-frame while preserving same ID");

    // Acquire temporary buffers
    const int table_idx = g.Tables.GetIndex(table);
    if (++g.TablesTempDataStacked > g.TablesTempData.Size)
        g.TablesTempData.resize(g.TablesTempDataStacked, ImGuiTableTempData());
    ImGuiTableTempData* temp_data = table->TempData = &g.TablesTempData[g.TablesTempDataStacked - 1];
    temp_data->TableIndex = table_idx;
    table->DrawSplitter = &table->TempData->DrawSplitter;
    table->DrawSplitter->Clear();

    // Fix flags
    table->IsDefaultSizingPolicy = (flags & ImGuiTableFlags_SizingMask_) == 0;
    flags = TableFixFlags(flags, outer_window);

    // Initialize
    table->ID = id;
    table->Flags = flags;
    table->InstanceCurrent = (ImS16)instance_no;
    table->LastFrameActive = g.FrameCount;
    table->OuterWindow = table->InnerWindow = outer_window;
    table->ColumnsCount = columns_count;
    table->IsLayoutLocked = false;
    table->InnerWidth = inner_width;
    temp_data->UserOuterSize = outer_size;

    // When not using a child window, WorkRect.Max will grow as we append contents.
    if (use_child_window)
    {
        // Ensure no vertical scrollbar appears if we only want horizontal one, to make flag consistent
        // (we have no other way to disable vertical scrollbar of a window while keeping the horizontal one showing)
        ImVec2 override_content_size(FLT_MAX, FLT_MAX);
        if ((flags & ImGuiTableFlags_ScrollX) && !(flags & ImGuiTableFlags_ScrollY))
            override_content_size.y = FLT_MIN;

        // Ensure specified width (when not specified, Stretched columns will act as if the width == OuterWidth and
        // never lead to any scrolling). We don't handle inner_width < 0.0f, we could potentially use it to right-align
        // based on the right side of the child window work rect, which would require knowing ahead if we are going to
        // have decoration taking horizontal spaces (typically a vertical scrollbar).
        if ((flags & ImGuiTableFlags_ScrollX) && inner_width > 0.0f)
            override_content_size.x = inner_width;

        if (override_content_size.x != FLT_MAX || override_content_size.y != FLT_MAX)
            SetNextWindowContentSize(ImVec2(override_content_size.x != FLT_MAX ? override_content_size.x : 0.0f, override_content_size.y != FLT_MAX ? override_content_size.y : 0.0f));

        // Reset scroll if we are reactivating it
        if ((table_last_flags & (ImGuiTableFlags_ScrollX | ImGuiTableFlags_ScrollY)) == 0)
            SetNextWindowScroll(ImVec2(0.0f, 0.0f));

        // Create scrolling region (without border and zero window padding)
        ImGuiWindowFlags child_flags = (flags & ImGuiTableFlags_ScrollX) ? ImGuiWindowFlags_HorizontalScrollbar : ImGuiWindowFlags_None;
        BeginChildEx(name, instance_id, outer_rect.GetSize(), false, child_flags);
        table->InnerWindow = g.CurrentWindow;
        table->WorkRect = table->InnerWindow->WorkRect;
        table->OuterRect = table->InnerWindow->Rect();
        table->InnerRect = table->InnerWindow->InnerRect;
        IM_ASSERT(table->InnerWindow->WindowPadding.x == 0.0f && table->InnerWindow->WindowPadding.y == 0.0f && table->InnerWindow->WindowBorderSize == 0.0f);
    }
    else
    {
        // For non-scrolling tables, WorkRect == OuterRect == InnerRect.
        // But at this point we do NOT have a correct value for .Max.y (unless a height has been explicitly passed in). It will only be updated in EndTable().
        table->WorkRect = table->OuterRect = table->InnerRect = outer_rect;
    }

    // Push a standardized ID for both child-using and not-child-using tables
    PushOverrideID(instance_id);

    // Backup a copy of host window members we will modify
    ImGuiWindow* inner_window = table->InnerWindow;
    table->HostIndentX = inner_window->DC.Indent.x;
    table->HostClipRect = inner_window->ClipRect;
    table->HostSkipItems = inner_window->SkipItems;
    temp_data->HostBackupWorkRect = inner_window->WorkRect;
    temp_data->HostBackupParentWorkRect = inner_window->ParentWorkRect;
    temp_data->HostBackupColumnsOffset = outer_window->DC.ColumnsOffset;
    temp_data->HostBackupPrevLineSize = inner_window->DC.PrevLineSize;
    temp_data->HostBackupCurrLineSize = inner_window->DC.CurrLineSize;
    temp_data->HostBackupCursorMaxPos = inner_window->DC.CursorMaxPos;
    temp_data->HostBackupItemWidth = outer_window->DC.ItemWidth;
    temp_data->HostBackupItemWidthStackSize = outer_window->DC.ItemWidthStack.Size;
    inner_window->DC.PrevLineSize = inner_window->DC.CurrLineSize = ImVec2(0.0f, 0.0f);

    // Padding and Spacing
    // - None               ........Content..... Pad .....Content........
    // - PadOuter           | Pad ..Content..... Pad .....Content.. Pad |
    // - PadInner           ........Content.. Pad | Pad ..Content........
    // - PadOuter+PadInner  | Pad ..Content.. Pad | Pad ..Content.. Pad |
    const bool pad_outer_x = (flags & ImGuiTableFlags_NoPadOuterX) ? false : (flags & ImGuiTableFlags_PadOuterX) ? true : (flags & ImGuiTableFlags_BordersOuterV) != 0;
    const bool pad_inner_x = (flags & ImGuiTableFlags_NoPadInnerX) ? false : true;
    const float inner_spacing_for_border = (flags & ImGuiTableFlags_BordersInnerV) ? TABLE_BORDER_SIZE : 0.0f;
    const float inner_spacing_explicit = (pad_inner_x && (flags & ImGuiTableFlags_BordersInnerV) == 0) ? g.Style.CellPadding.x : 0.0f;
    const float inner_padding_explicit = (pad_inner_x && (flags & ImGuiTableFlags_BordersInnerV) != 0) ? g.Style.CellPadding.x : 0.0f;
    table->CellSpacingX1 = inner_spacing_explicit + inner_spacing_for_border;
    table->CellSpacingX2 = inner_spacing_explicit;
    table->CellPaddingX = inner_padding_explicit;
    table->CellPaddingY = g.Style.CellPadding.y;

    const float outer_padding_for_border = (flags & ImGuiTableFlags_BordersOuterV) ? TABLE_BORDER_SIZE : 0.0f;
    const float outer_padding_explicit = pad_outer_x ? g.Style.CellPadding.x : 0.0f;
    table->OuterPaddingX = (outer_padding_for_border + outer_padding_explicit) - table->CellPaddingX;

    table->CurrentColumn = -1;
    table->CurrentRow = -1;
    table->RowBgColorCounter = 0;
    table->LastRowFlags = ImGuiTableRowFlags_None;
    table->InnerClipRect = (inner_window == outer_window) ? table->WorkRect : inner_window->ClipRect;
    table->InnerClipRect.ClipWith(table->WorkRect);     // We need this to honor inner_width
    table->InnerClipRect.ClipWithFull(table->HostClipRect);
    table->InnerClipRect.Max.y = (flags & ImGuiTableFlags_NoHostExtendY) ? ImMin(table->InnerClipRect.Max.y, inner_window->WorkRect.Max.y) : inner_window->ClipRect.Max.y;

    table->RowPosY1 = table->RowPosY2 = table->WorkRect.Min.y; // This is needed somehow
    table->RowTextBaseline = 0.0f; // This will be cleared again by TableBeginRow()
    table->FreezeRowsRequest = table->FreezeRowsCount = 0; // This will be setup by TableSetupScrollFreeze(), if any
    table->FreezeColumnsRequest = table->FreezeColumnsCount = 0;
    table->IsUnfrozenRows = true;
    table->DeclColumnsCount = 0;

    // Using opaque colors facilitate overlapping elements of the grid
    table->BorderColorStrong = GetColorU32(ImGuiCol_TableBorderStrong);
    table->BorderColorLight = GetColorU32(ImGuiCol_TableBorderLight);

    // Make table current
    g.CurrentTable = table;
    outer_window->DC.CurrentTableIdx = table_idx;
    if (inner_window != outer_window) // So EndChild() within the inner window can restore the table properly.
        inner_window->DC.CurrentTableIdx = table_idx;

    if ((table_last_flags & ImGuiTableFlags_Reorderable) && (flags & ImGuiTableFlags_Reorderable) == 0)
        table->IsResetDisplayOrderRequest = true;

    // Mark as used
    if (table_idx >= g.TablesLastTimeActive.Size)
        g.TablesLastTimeActive.resize(table_idx + 1, -1.0f);
    g.TablesLastTimeActive[table_idx] = (float)g.Time;
    temp_data->LastTimeActive = (float)g.Time;
    table->MemoryCompacted = false;

    // Setup memory buffer (clear data if columns count changed)
    ImGuiTableColumn* old_columns_to_preserve = NULL;
    void* old_columns_raw_data = NULL;
    const int old_columns_count = table->Columns.size();
    if (old_columns_count != 0 && old_columns_count != columns_count)
    {
        // Attempt to preserve width on column count change (#4046)
        old_columns_to_preserve = table->Columns.Data;
        old_columns_raw_data = table->RawData;
        table->RawData = NULL;
    }
    if (table->RawData == NULL)
    {
        TableBeginInitMemory(table, columns_count);
        table->IsInitializing = table->IsSettingsRequestLoad = true;
    }
    if (table->IsResetAllRequest)
        TableResetSettings(table);
    if (table->IsInitializing)
    {
        // Initialize
        table->SettingsOffset = -1;
        table->IsSortSpecsDirty = true;
        table->InstanceInteracted = -1;
        table->ContextPopupColumn = -1;
        table->ReorderColumn = table->ResizedColumn = table->LastResizedColumn = -1;
        table->AutoFitSingleColumn = -1;
        table->HoveredColumnBody = table->HoveredColumnBorder = -1;
        for (int n = 0; n < columns_count; n++)
        {
            ImGuiTableColumn* column = &table->Columns[n];
            if (old_columns_to_preserve && n < old_columns_count)
            {
                // FIXME: We don't attempt to preserve column order in this path.
                *column = old_columns_to_preserve[n];
            }
            else
            {
                float width_auto = column->WidthAuto;
                *column = ImGuiTableColumn();
                column->WidthAuto = width_auto;
                column->IsPreserveWidthAuto = true; // Preserve WidthAuto when reinitializing a live table: not technically necessary but remove a visible flicker
                column->IsEnabled = column->IsUserEnabled = column->IsUserEnabledNextFrame = true;
            }
            column->DisplayOrder = table->DisplayOrderToIndex[n] = (ImGuiTableColumnIdx)n;
        }
    }
    if (old_columns_raw_data)
        IM_FREE(old_columns_raw_data);

    // Load settings
    if (table->IsSettingsRequestLoad)
        TableLoadSettings(table);

    // Handle DPI/font resize
    // This is designed to facilitate DPI changes with the assumption that e.g. style.CellPadding has been scaled as well.
    // It will also react to changing fonts with mixed results. It doesn't need to be perfect but merely provide a decent transition.
    // FIXME-DPI: Provide consistent standards for reference size. Perhaps using g.CurrentDpiScale would be more self explanatory.
    // This is will lead us to non-rounded WidthRequest in columns, which should work but is a poorly tested path.
    const float new_ref_scale_unit = g.FontSize; // g.Font->GetCharAdvance('A') ?
    if (table->RefScale != 0.0f && table->RefScale != new_ref_scale_unit)
    {
        const float scale_factor = new_ref_scale_unit / table->RefScale;
        //IMGUI_DEBUG_LOG("[table] %08X RefScaleUnit %.3f -> %.3f, scaling width by %.3f\n", table->ID, table->RefScaleUnit, new_ref_scale_unit, scale_factor);
        for (int n = 0; n < columns_count; n++)
            table->Columns[n].WidthRequest = table->Columns[n].WidthRequest * scale_factor;
    }
    table->RefScale = new_ref_scale_unit;

    // Disable output until user calls TableNextRow() or TableNextColumn() leading to the TableUpdateLayout() call..
    // This is not strictly necessary but will reduce cases were "out of table" output will be misleading to the user.
    // Because we cannot safely assert in EndTable() when no rows have been created, this seems like our best option.
    inner_window->SkipItems = true;

    // Clear names
    // At this point the ->NameOffset field of each column will be invalid until TableUpdateLayout() or the first call to TableSetupColumn()
    if (table->ColumnsNames.Buf.Size > 0)
        table->ColumnsNames.Buf.resize(0);

    // Apply queued resizing/reordering/hiding requests
    TableBeginApplyRequests(table);

    return true;
}